

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_multisample_target.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  ALLEGRO_FONT *pAVar7;
  char cVar8;
  long lVar9;
  undefined8 uVar10;
  long *plVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  uint uVar15;
  code *pcVar16;
  ulong uVar17;
  char *format;
  int i;
  bool bVar18;
  bool bVar19;
  int iVar20;
  ulong uVar21;
  float fVar22;
  undefined4 uVar23;
  float fVar24;
  undefined4 uVar25;
  ALLEGRO_EVENT event;
  int local_78 [8];
  int local_58;
  
  pcVar16 = atexit;
  cVar8 = al_install_system(0x85020700,atexit);
  if (cVar8 == '\0') {
    format = "Failed to init Allegro.\n";
  }
  else {
    cVar8 = al_init_image_addon();
    if (cVar8 == '\0') {
      format = "Failed to init IIO addon.\n";
    }
    else {
      al_init_font_addon();
      example.font = (ALLEGRO_FONT *)al_create_builtin_font();
      al_init_primitives_addon();
      pcVar16 = (code *)0x1cc;
      lVar9 = al_create_display(0x294,0x1cc);
      if (lVar9 == 0) {
        format = "Error creating display.\n";
      }
      else {
        cVar8 = al_install_keyboard();
        if (cVar8 != '\0') {
          al_set_new_bitmap_flags(1);
          uVar10 = al_create_bitmap(0x18,0x18);
          uVar21 = 0;
          plVar11 = (long *)al_lock_bitmap(uVar10,0x11,0);
          iVar20 = *(int *)((long)plVar11 + 0xc);
          lVar14 = *plVar11 + 3;
          do {
            uVar17 = 0;
            do {
              *(undefined2 *)(lVar14 + -3 + uVar17 * 4) = 0;
              *(undefined1 *)(lVar14 + -1 + uVar17 * 4) = 0;
              *(byte *)(lVar14 + uVar17 * 4) = -((char)(uVar17 >> 3) + (char)(uVar21 >> 3) & 1U);
              uVar17 = uVar17 + 1;
            } while (uVar17 != 0x18);
            uVar21 = uVar21 + 1;
            lVar14 = lVar14 + iVar20;
          } while (uVar21 != 0x18);
          al_unlock_bitmap(uVar10);
          al_set_new_bitmap_flags(0);
          al_set_new_bitmap_samples(0);
          example.targets[0] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          example.targets[1] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          al_set_new_bitmap_samples(4);
          example.targets[2] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          example.targets[3] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          al_set_new_bitmap_samples(0);
          al_set_new_bitmap_flags(0xc0);
          example.bitmap_filter = (ALLEGRO_BITMAP *)al_clone_bitmap(uVar10);
          al_set_new_bitmap_flags(0);
          example.bitmap_normal = (ALLEGRO_BITMAP *)al_clone_bitmap(uVar10);
          example.sub = (ALLEGRO_BITMAP *)al_create_sub_bitmap(uVar10,0,0,0x1e,0x1e);
          example.step[0] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[1] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[2] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[3] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          uVar10 = al_create_timer(0x11111111);
          uVar12 = al_create_event_queue();
          uVar13 = al_get_keyboard_event_source();
          al_register_event_source(uVar12,uVar13);
          uVar13 = al_get_timer_event_source(uVar10);
          al_register_event_source(uVar12,uVar13);
          uVar13 = al_get_display_event_source(lVar9);
          al_register_event_source(uVar12,uVar13);
          al_start_timer(uVar10);
          do {
            al_set_target_bitmap(example.targets[1]);
            draw("filtered",example.bitmap_filter);
            al_set_target_bitmap(example.targets[0]);
            draw("no filter",example.bitmap_normal);
            al_set_target_bitmap(example.targets[3]);
            draw("filtered, multi-sample x4",example.bitmap_filter);
            al_set_target_bitmap(example.targets[2]);
            draw("no filter, multi-sample x4",example.bitmap_normal);
            if (example.update_step == true) {
              fVar22 = (float)example.step_y;
              fVar24 = (float)example.step_x;
              lVar9 = 0;
              do {
                al_set_target_bitmap(example.step[lVar9]);
                al_reparent_bitmap(example.sub,example.targets[lVar9],(int)fVar24,(int)fVar22,0x1e,
                                   0x1e);
                __cxa_atexit(0,0,example.sub,0);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 4);
              example.update_step = false;
            }
            uVar10 = al_get_current_display();
            al_set_target_backbuffer(uVar10);
            al_map_rgb_f(0x3f000000,0,0);
            al_clear_to_color();
            bVar18 = false;
            __cxa_atexit(0x41a00000,0x41a00000,example.targets[0],0);
            __cxa_atexit(0x41a00000,0x43700000,example.targets[1],0);
            __cxa_atexit(0x43aa0000,0x41a00000,example.targets[2],0);
            __cxa_atexit(0x43aa0000,0x43700000,example.targets[3],0);
            al_draw_scaled_rotated_bitmap
                      (0x41700000,0x41700000,0x43870000,0x432a0000,0x40800000,0x40800000,0,
                       example.step[0],0);
            al_draw_scaled_rotated_bitmap
                      (0x41700000,0x41700000,0x43870000,0x43c30000,0x40800000,0x40800000,
                       example.step[1],0);
            al_draw_scaled_rotated_bitmap
                      (0x41700000,0x41700000,0x44138000,0x432a0000,0x40800000,0x40800000,
                       example.step[2],0);
            al_draw_scaled_rotated_bitmap(example.step[3],0);
            al_flip_display();
            bVar19 = false;
            do {
              do {
                while (al_wait_for_event(uVar12,local_78), local_78[0] == 0x2a) {
                  cVar8 = al_is_event_queue_empty(uVar12);
                  bVar18 = true;
                  if (cVar8 != '\0') {
                    return 0;
                  }
                }
                if (local_78[0] == 0x1e) {
                  example.bitmap_t = example.bitmap_t + 1.0;
                  iVar20 = 0;
                  lVar9 = 0;
                  do {
                    dVar1 = sin((double)(((float)iVar20 + example.bitmap_t) / 180.0) *
                                3.141592653589793);
                    dVar2 = (double)((float)(int)lVar9 * 6.2831855 * 0.0625);
                    dVar3 = cos(dVar2);
                    example.bitmap_x[lVar9] = (float)(dVar3 * (double)((float)dVar1 * 90.0) + 100.0)
                    ;
                    dVar2 = sin(dVar2);
                    example.bitmap_y[lVar9] = (float)(dVar2 * (double)((float)dVar1 * 90.0) + 100.0)
                    ;
                    lVar9 = lVar9 + 1;
                    iVar20 = iVar20 + 0x28;
                  } while (lVar9 != 8);
                  if (example.step_t == 0) {
                    example.step_y = (int)(example.bitmap_y[1] + -15.0);
                    example.step_x = (int)(example.bitmap_x[1] + -15.0);
                    example.update_step = true;
                    example.step_t = 0x3c;
                  }
                  example.step_t = example.step_t + -1;
                  bVar19 = true;
                }
                else if (local_78[0] == 0xb) {
                  bVar18 = (bool)(local_58 == 0x3b | bVar18);
                }
                cVar8 = al_is_event_queue_empty(uVar12);
              } while (cVar8 == '\0');
              if (bVar18) {
                return 0;
              }
              bVar18 = false;
              bVar6 = !bVar19;
              bVar19 = false;
            } while (bVar6);
          } while( true );
        }
        format = "Error installing keyboard.\n";
      }
    }
  }
  abort_example(format);
  al_color_name("white");
  al_clear_to_color();
  pAVar7 = example.font;
  uVar15 = 0;
  al_map_rgb(0,0,0);
  al_draw_text(pAVar7,0,format);
  dVar1 = 0.0;
  do {
    uVar25 = 0x3f800000;
    uVar23 = al_color_hsv((float)(uVar15 >> 4),0x3f800000,0x3f800000);
    dVar2 = (double)(float)(dVar1 * 6.283185307179586 * 0.0625);
    dVar3 = cos(dVar2);
    dVar4 = sin(dVar2);
    dVar5 = cos(dVar2);
    dVar2 = sin(dVar2);
    al_draw_line((float)(dVar3 * 10.0 + 100.0),(float)(dVar4 * 10.0 + 100.0),
                 (float)(dVar5 * 90.0 + 100.0),(float)(dVar2 * 90.0 + 100.0),uVar23,uVar25,
                 0x40400000);
    dVar1 = dVar1 + 1.0;
    uVar15 = uVar15 + 0x168;
  } while (uVar15 != 0x1680);
  lVar9 = 0;
  do {
    iVar20 = al_get_bitmap_width(pcVar16);
    iVar20 = al_draw_rotated_bitmap
                       ((float)(iVar20 / 2),(float)(iVar20 / 2),example.bitmap_x[lVar9],
                        example.bitmap_y[lVar9],(float)(int)lVar9 * 6.2831855 * 0.0625,pcVar16,0);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  return iVar20;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_DISPLAY *display;
   int w = 20 + 300 + 20 + 300 + 20, h = 20 + 200 + 20 + 200 + 20;
   bool done = false;
   bool need_redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_font_addon();
   example.font = al_create_builtin_font();

   al_init_primitives_addon();

   init_platform_specific();

   display = al_create_display(w, h);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   init();

   timer = al_create_timer(1.0 / FPS);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   while (!done) {
      ALLEGRO_EVENT event;

      if (need_redraw) {
         redraw();
         al_flip_display();
         need_redraw = false;
      }

      while (true) {
         al_wait_for_event(queue, &event);
         switch (event.type) {
            case ALLEGRO_EVENT_KEY_CHAR:
               if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
                  done = true;
               break;

            case ALLEGRO_EVENT_DISPLAY_CLOSE:
               done = true;
               break;

            case ALLEGRO_EVENT_TIMER:
               update();
               need_redraw = true;
               break;
         }
         if (al_is_event_queue_empty(queue))
            break;
      }
   }

   return 0;
}